

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O0

void __thiscall OpenMD::Electrostatic::Electrostatic(Electrostatic *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  ElectrostaticAtomData *in_stack_ffffffffffffff00;
  SimInfo *info;
  FluctuatingChargeForces *this_00;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  allocator<char> local_9 [9];
  
  ElectrostaticInteraction::ElectrostaticInteraction
            ((ElectrostaticInteraction *)in_stack_ffffffffffffff00);
  *in_RDI = &PTR__Electrostatic_00512c18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::allocator<char>::~allocator(local_9);
  *(undefined1 *)(in_RDI + 5) = 0;
  *(undefined1 *)((long)in_RDI + 0x29) = 0;
  *(undefined1 *)((long)in_RDI + 0x2a) = 0;
  *(undefined1 *)((long)in_RDI + 0x2b) = 0;
  *(undefined1 *)((long)in_RDI + 0x2c) = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x40defc);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x40df12);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x40df28);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x40df41);
  std::vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>::vector
            ((vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
              *)0x40df5a);
  std::
  vector<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
  ::vector((vector<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
            *)0x40df73);
  in_RDI[0x1f] = 0;
  in_RDI[0x20] = 0;
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x40dfa2);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticSummationMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticSummationMethod>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticSummationMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticSummationMethod>_>_>
         *)0x40dfbb);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticScreeningMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticScreeningMethod>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticScreeningMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticScreeningMethod>_>_>
         *)0x40dfd4);
  std::shared_ptr<OpenMD::CubicSpline>::shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40dff0);
  std::shared_ptr<OpenMD::CubicSpline>::shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e00c);
  std::shared_ptr<OpenMD::CubicSpline>::shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e028);
  std::shared_ptr<OpenMD::CubicSpline>::shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e044);
  std::shared_ptr<OpenMD::CubicSpline>::shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e060);
  std::shared_ptr<OpenMD::CubicSpline>::shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e07c);
  std::shared_ptr<OpenMD::CubicSpline>::shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e098);
  std::shared_ptr<OpenMD::CubicSpline>::shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e0b4);
  std::shared_ptr<OpenMD::CubicSpline>::shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e0d0);
  ElectrostaticAtomData::ElectrostaticAtomData(in_stack_ffffffffffffff00);
  ElectrostaticAtomData::ElectrostaticAtomData(in_stack_ffffffffffffff00);
  Vector3<double>::Vector3((Vector3<double> *)0x40e11d);
  Vector3<double>::Vector3((Vector3<double> *)0x40e133);
  this_00 = (FluctuatingChargeForces *)(in_RDI + 0x9c);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x40e14e);
  info = (SimInfo *)(in_RDI + 0xa5);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x40e169);
  Vector3<double>::Vector3((Vector3<double> *)0x40e17f);
  Vector3<double>::Vector3((Vector3<double> *)0x40e195);
  Vector3<double>::Vector3((Vector3<double> *)0x40e1ab);
  Vector3<double>::Vector3((Vector3<double> *)0x40e1c1);
  Vector3<double>::Vector3((Vector3<double> *)0x40e1d7);
  Vector3<double>::Vector3((Vector3<double> *)0x40e1ed);
  Vector3<double>::Vector3((Vector3<double> *)0x40e203);
  Vector3<double>::Vector3((Vector3<double> *)0x40e219);
  Vector3<double>::Vector3((Vector3<double> *)0x40e22f);
  Vector3<double>::Vector3((Vector3<double> *)0x40e245);
  Vector3<double>::Vector3((Vector3<double> *)0x40e25b);
  Vector3<double>::Vector3((Vector3<double> *)0x40e271);
  Vector3<double>::Vector3((Vector3<double> *)0x40e287);
  Vector3<double>::Vector3((Vector3<double> *)0x40e29d);
  Vector3<double>::Vector3((Vector3<double> *)0x40e2b3);
  Vector3<double>::Vector3((Vector3<double> *)0x40e2c9);
  Vector3<double>::Vector3((Vector3<double> *)0x40e2df);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x40e2fa);
  Vector3<double>::Vector3((Vector3<double> *)0x40e310);
  Vector3<double>::Vector3((Vector3<double> *)0x40e326);
  Vector3<double>::Vector3((Vector3<double> *)0x40e33c);
  Vector3<double>::Vector3((Vector3<double> *)0x40e352);
  Vector3<double>::Vector3((Vector3<double> *)0x40e368);
  Vector3<double>::Vector3((Vector3<double> *)0x40e37e);
  Vector3<double>::Vector3((Vector3<double> *)0x40e394);
  Vector3<double>::Vector3((Vector3<double> *)0x40e3aa);
  std::shared_ptr<OpenMD::CubicSpline>::shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e3c5);
  Vector3<double>::Vector3((Vector3<double> *)0x40e3d9);
  pvVar1 = operator_new(0x100);
  FluctuatingChargeForces::FluctuatingChargeForces(this_00,info);
  in_RDI[0x21] = pvVar1;
  return;
}

Assistant:

Electrostatic::Electrostatic() :
      name_("Electrostatic"), initialized_(false), haveCutoffRadius_(false),
      haveDampingAlpha_(false), haveDielectric_(false),
      haveElectroSplines_(false), info_(NULL), forceField_(NULL)

  {
    flucQ_ = new FluctuatingChargeForces(info_);
  }